

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_unmap_aarch64(uc_struct_conflict2 *uc,MemoryRegion *mr)

{
  uc_invalidate_tb_t_conflict2 p_Var1;
  uint64_t uVar2;
  undefined1 a [16];
  Int128 IVar3;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  hwaddr addr;
  
  if (uc->cpu != (CPUState *)0x0) {
    p_Var1 = uc->uc_invalidate_tb;
    uVar2 = mr->addr;
    IVar3 = mr->size;
    a._8_8_ = unaff_R12;
    a._0_8_ = unaff_RBX;
    int128_get64((Int128)a);
    (*p_Var1)(uc,uVar2,(size_t)IVar3);
    for (addr = mr->addr; mr->end != addr && -1 < (long)(mr->end - addr);
        addr = addr + uc->target_page_size) {
      tlb_flush_page_aarch64(uc->cpu,addr);
    }
  }
  memory_region_del_subregion_aarch64(uc->system_memory,mr);
  memory_region_remove_mapped_block(uc,mr,true);
  return;
}

Assistant:

void memory_unmap(struct uc_struct *uc, MemoryRegion *mr)
{
    hwaddr addr;

    if (uc->cpu) {
        // We also need to remove all tb cache
        uc->uc_invalidate_tb(uc, mr->addr, int128_get64(mr->size));

        // Make sure all pages associated with the MemoryRegion are flushed
        // Only need to do this if we are in a running state
        for (addr = mr->addr; (int64_t)(mr->end - addr) > 0; addr += uc->target_page_size) {
           tlb_flush_page(uc->cpu, addr);
        }
    }
    memory_region_del_subregion(uc->system_memory, mr);
    memory_region_remove_mapped_block(uc, mr, true);
}